

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O3

bool tinyusdz::tydra::detail::ToMaterialPrim
               (RenderScene *scene,string *abs_path,size_t material_id,Prim *dst,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pRVar3;
  pointer pcVar4;
  pointer pUVar5;
  void *pvVar6;
  pointer pSVar7;
  Prim *pPVar8;
  bool bVar9;
  bool bVar10;
  long *plVar11;
  ulong uVar12;
  ostream *poVar13;
  string *psVar14;
  size_type *psVar15;
  size_type *psVar16;
  long lVar17;
  char *pcVar18;
  undefined1 auVar19 [8];
  Shader *node;
  pointer prim;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string abs_mat_path;
  anon_class_16_2_2591ee82 ConstructUVTexture;
  vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> shader_nodes;
  Prim matPrim;
  Prim shaderNodePrim;
  string abs_shader_path;
  Prim shaderPrim;
  Material mat;
  string *local_4c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4bf8;
  Prim *local_4bd8;
  RenderScene *local_4bd0;
  undefined1 local_4bc8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4ba8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b98;
  anon_class_16_2_2591ee82 local_4b88;
  vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> local_4b78;
  undefined1 local_4b58 [8];
  undefined8 local_4b50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4b48;
  bool bStack_4b38;
  undefined7 uStack_4b37;
  bool bStack_4b30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b28;
  _Alloc_hider local_4b18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b08;
  _Alloc_hider local_4af8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4ae8;
  _Alloc_hider local_4ad8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4ac8;
  _Alloc_hider local_4ab8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4aa8 [42];
  Prim local_4808;
  string local_44b8;
  Shader local_4498;
  UsdPreviewSurface local_3d30;
  Material local_df0;
  
  local_4b88.err = &local_4c00;
  pRVar3 = (scene->materials).
           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4c00 = err;
  local_4bd0 = scene;
  local_4b88.scene = scene;
  Material::Material(&local_df0);
  ::std::__cxx11::string::_M_assign((string *)&local_df0);
  local_4498.super_UsdShadePrim.name._M_dataplus._M_p =
       (pointer)&local_4498.super_UsdShadePrim.name.field_2;
  local_4498.super_UsdShadePrim.name._M_string_length = 0;
  local_4498.super_UsdShadePrim.name.field_2._M_local_buf[0] = '\0';
  local_4498.super_UsdShadePrim.spec = Def;
  local_4498.super_UsdShadePrim.parent_id = -1;
  local_4498.super_UsdShadePrim.meta.kind.contained = (storage_t<tinyusdz::Kind>)0x0;
  local_4498.super_UsdShadePrim.meta._kind_str._M_dataplus._M_p =
       (pointer)&local_4498.super_UsdShadePrim.meta._kind_str.field_2;
  local_4498.super_UsdShadePrim.meta.active.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.active.contained = (storage_t<bool>)0x0;
  local_4498.super_UsdShadePrim.meta.hidden.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.hidden.contained = (storage_t<bool>)0x0;
  local_4498.super_UsdShadePrim.meta.kind.has_value_ = false;
  local_4498.super_UsdShadePrim.meta._kind_str._M_string_length = 0;
  local_4498.super_UsdShadePrim.meta._kind_str.field_2._M_local_buf[0] = '\0';
  local_4498.super_UsdShadePrim.meta.assetInfo.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.clips.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.displayName.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.displayName.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.displayName.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.displayName.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = (_Base_ptr)
            ((long)&local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl + 8);
  local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  local_4498.super_UsdShadePrim.meta.assetInfo.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.assetInfo.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.assetInfo.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.assetInfo.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.assetInfo.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.assetInfo.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.customData.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.doc.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.customData.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.customData.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.customData.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.customData.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.customData.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.customData.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.doc.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.doc.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.doc.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.doc.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.doc.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.doc.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.comment.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.comment.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.comment.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.comment.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.comment.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.comment.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.comment.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.apiSchemas.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.apiSchemas.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.apiSchemas.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.apiSchemas.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.apiSchemas.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sdrMetadata.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.instanceable.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.instanceable.contained = (storage_t<bool>)0x0;
  local_4498.super_UsdShadePrim.meta.references.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.clips.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.clips.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.clips.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.clips.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.clips.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.clips.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.payload.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.references.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.references.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.references.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.references.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.inherits.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.payload.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.payload.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.payload.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.payload.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantSets.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.inherits.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.inherits.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.inherits.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.inherits.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variants.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.variantSets.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantSets.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantSets.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.variantSets.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.specializes.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.variants.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variants.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variants.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variants.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variants.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.variants.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sceneName.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.specializes.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.specializes.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.specializes.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.specializes.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.displayName.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.sceneName.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sceneName.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.sceneName.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.sceneName.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl + 8);
  local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_4498.super_UsdShadePrim.meta.properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4498.super_UsdShadePrim.meta._905_8_ = 0;
  local_4498.super_UsdShadePrim.meta.properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim.meta.properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4498.super_UsdShadePrim.meta.properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4498.super_UsdShadePrim.meta.primChildren.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4498.super_UsdShadePrim.meta.primChildren.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4498.super_UsdShadePrim.meta.primChildren.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim.meta.variantChildren.has_value_ = false;
  local_4498.super_UsdShadePrim.meta.inheritPaths.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.meta.inheritPaths.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.meta.inheritPaths.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.inheritPaths.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantChildren.contained._16_1_ = 0;
  local_4498.super_UsdShadePrim.meta._977_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantChildren.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.variantChildren.contained._8_1_ = 0;
  local_4498.super_UsdShadePrim.meta.variantChildren.contained._9_7_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.interpolation.contained =
       (storage_t<tinyusdz::Interpolation>)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.elementSize.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.hidden.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.hidden.contained = (storage_t<bool>)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.comment.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.weight.contained = (storage_t<double>)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.connectability.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.bindMaterialAs.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.bindMaterialAs.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.bindMaterialAs.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.bindMaterialAs.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = (_Base_ptr)((long)&local_4498.super_UsdShadePrim.purpose._metas.meta._M_t + 8);
  local_4498.super_UsdShadePrim.purpose._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  local_4498.super_UsdShadePrim.purpose._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.customData.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.comment.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.comment.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.comment.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.comment.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.comment.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.comment.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.weight.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.customData.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.customData.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.customData.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.customData.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.customData.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.customData.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.outputName.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.connectability.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.connectability.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.connectability.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.connectability.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.renderType.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.outputName.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.outputName.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.outputName.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.outputName.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.renderType.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.renderType.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.renderType.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.renderType.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.displayName.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.contained._32_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.contained._40_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.sdrMetadata.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.displayGroup.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.displayName.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.displayName.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.displayName.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.displayName.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.bindMaterialAs.has_value_ = false;
  local_4498.super_UsdShadePrim.purpose._metas.displayGroup.contained._16_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.displayGroup.contained._24_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.displayGroup.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.displayGroup.contained._8_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantSetChildren.contained._16_1_ = 0;
  local_4498.super_UsdShadePrim._1057_8_ = 0;
  local_4498.super_UsdShadePrim.meta.variantSetChildren.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_4498.super_UsdShadePrim.meta.variantSetChildren.contained._8_1_ = 0;
  local_4498.super_UsdShadePrim.meta.variantSetChildren.contained._9_7_ = 0;
  local_4498.super_UsdShadePrim.purpose._attrib.contained = (storage_t<tinyusdz::Purpose>)0x0;
  local_4498.super_UsdShadePrim.purpose._empty = false;
  local_4498.super_UsdShadePrim.purpose._paths.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4498.super_UsdShadePrim.purpose._537_8_ = 0;
  local_4498.super_UsdShadePrim.purpose._paths.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim.purpose._paths.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4498.super_UsdShadePrim.purpose._paths.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4498.super_UsdShadePrim.purpose._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4498.super_UsdShadePrim.purpose._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  local_4498.super_UsdShadePrim.purpose._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim.purpose._fallback = Default;
  local_4498.super_UsdShadePrim.purpose._blocked = false;
  local_4498.super_UsdShadePrim.references.first = ResetToExplicit;
  local_4498.super_UsdShadePrim.payload.second.
  super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4498.super_UsdShadePrim.payload.second.
  super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim.payload.second.
  super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_4498.super_UsdShadePrim.references.second.
  super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_4498.super_UsdShadePrim._1660_8_ = 0;
  local_4498.super_UsdShadePrim.references.second.
  super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim.references.second.
  super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_4498.super_UsdShadePrim.references.second.
  super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_4498.super_UsdShadePrim._properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4498.super_UsdShadePrim._properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.super_UsdShadePrim._properties.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4498.super_UsdShadePrim._primChildren.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4498.super_UsdShadePrim._primChildren.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4498.super_UsdShadePrim._primChildren.
  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4498.info_id._M_dataplus._M_p = (pointer)&local_4498.info_id.field_2;
  local_4498.info_id._M_string_length = 0;
  local_4498.info_id.field_2._M_local_buf[0] = '\0';
  local_4498.value.v_.vtable =
       (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_4498.value.v_.storage.dynamic = (void *)0x0;
  local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = local_4498.super_UsdShadePrim.meta.unregisteredMetas._M_t._M_impl.super__Rb_tree_header
             ._M_header._M_left;
  local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4498.super_UsdShadePrim.meta.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4498.super_UsdShadePrim.purpose._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = local_4498.super_UsdShadePrim.purpose._metas.meta._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
  local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4498.super_UsdShadePrim.variantSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4498.super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::_M_replace((ulong)&local_4498,0,(char *)0x0,0x5e0940);
  paVar1 = &local_3d30.super_ShaderNode.super_UsdShadePrim.name.field_2;
  pcVar4 = (abs_path->_M_dataplus)._M_p;
  local_3d30.super_ShaderNode.super_UsdShadePrim.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d30,pcVar4,pcVar4 + abs_path->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_3d30);
  plVar11 = (long *)::std::__cxx11::string::_M_append
                              ((char *)&local_3d30,
                               (ulong)local_df0.super_UsdShadePrim.name._M_dataplus._M_p);
  local_4bc8._0_8_ = local_4bc8 + 0x10;
  psVar14 = (string *)(plVar11 + 2);
  if ((string *)*plVar11 == psVar14) {
    local_4bc8._16_8_ = (psVar14->_M_dataplus)._M_p;
    local_4bc8._24_8_ = plVar11[3];
  }
  else {
    local_4bc8._16_8_ = (psVar14->_M_dataplus)._M_p;
    local_4bc8._0_8_ = (string *)*plVar11;
  }
  local_4bc8._8_8_ = plVar11[1];
  *plVar11 = (long)psVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d30.super_ShaderNode.super_UsdShadePrim.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d30.super_ShaderNode.super_UsdShadePrim.name._M_dataplus._M_p,
                    local_3d30.super_ShaderNode.super_UsdShadePrim.name.field_2.
                    _M_allocated_capacity + 1);
  }
  local_3d30.super_ShaderNode.super_UsdShadePrim.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d30,local_4bc8._0_8_,
             (pointer)(local_4bc8._0_8_ +
                      (long)(_Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                            local_4bc8._8_8_));
  ::std::__cxx11::string::append((char *)&local_3d30);
  plVar11 = (long *)::std::__cxx11::string::_M_append
                              ((char *)&local_3d30,
                               (ulong)local_4498.super_UsdShadePrim.name._M_dataplus._M_p);
  local_44b8._M_dataplus._M_p = (pointer)&local_44b8.field_2;
  psVar15 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_44b8.field_2._M_allocated_capacity = *psVar15;
    local_44b8.field_2._8_8_ = plVar11[3];
  }
  else {
    local_44b8.field_2._M_allocated_capacity = *psVar15;
    local_44b8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_44b8._M_string_length = plVar11[1];
  *plVar11 = (long)psVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d30.super_ShaderNode.super_UsdShadePrim.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d30.super_ShaderNode.super_UsdShadePrim.name._M_dataplus._M_p,
                    local_3d30.super_ShaderNode.super_UsdShadePrim.name.field_2.
                    _M_allocated_capacity + 1);
  }
  local_4b78.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (Shader *)0x0;
  local_4b78.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (Shader *)0x0;
  local_4b78.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UsdPreviewSurface::UsdPreviewSurface(&local_3d30);
  ::std::__cxx11::string::_M_replace
            ((ulong)&local_4498.info_id,0,(char *)local_4498.info_id._M_string_length,0x5d3c88);
  local_3d30.outputsSurface._authored = true;
  aStack_4b48._M_local_buf[8] = '\0';
  aStack_4b48._9_7_ = 0;
  bStack_4b38 = false;
  local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  aStack_4b48._M_local_buf[0] = '\0';
  aStack_4b48._M_allocated_capacity._1_7_ = 0;
  local_4b58._1_3_ = 0;
  local_4b58[0] = pRVar3[material_id].surfaceShader.useSpecularWorkflow;
  local_4b58._4_2_ = 1;
  nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
            ((optional<tinyusdz::Animatable<int>> *)&local_3d30.useSpecularWorkflow._attrib,
             (Animatable<int> *)local_4b58);
  if (local_4b50 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_4b50,
                    CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) - (long)local_4b50);
  }
  uVar12 = (ulong)pRVar3[material_id].surfaceShader.diffuseColor.texture_id;
  if ((long)uVar12 < 0) {
    local_4b58 = *(undefined1 (*) [8])pRVar3[material_id].surfaceShader.diffuseColor.value._M_elems;
    bStack_4b38 = false;
    uStack_4b37 = 0;
    bStack_4b30 = false;
    aStack_4b48._M_local_buf[0] = '\0';
    aStack_4b48._M_allocated_capacity._1_7_ = 0;
    aStack_4b48._M_local_buf[8] = '\0';
    aStack_4b48._9_7_ = 0;
    uVar12 = (ulong)local_4b50 >> 0x28;
    local_4b50._0_5_ =
         CONCAT14(true,*(float *)((long)&pRVar3[material_id].surfaceShader.diffuseColor.value + 8));
    local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(CONCAT35((int3)uVar12,(undefined5)local_4b50) & 0xffff00ffffffffff);
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::operator=
              ((optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *)
               &local_3d30.diffuseColor._attrib,(Animatable<tinyusdz::value::color3f> *)local_4b58);
    auVar19 = (undefined1  [8])
              CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]);
    if (auVar19 != (undefined1  [8])0x0) {
      uVar12 = CONCAT71(uStack_4b37,bStack_4b38) - (long)auVar19;
LAB_00322fe6:
      operator_delete((void *)auVar19,uVar12);
    }
LAB_00322feb:
    uVar12 = (ulong)pRVar3[material_id].surfaceShader.specularColor.texture_id;
    if (-1 < (long)uVar12) {
      pUVar5 = (local_4bd0->textures).
               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(local_4bd0->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                 -0x7d05f417d05f417d) < uVar12) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,"ToMaterialPrim",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x3e1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        pcVar18 = "Invalid texture_id for \'specularColor\' texture.";
LAB_00323551:
        lVar17 = 0x2f;
      }
      else {
        local_4bd8 = dst;
        local_4b58 = (undefined1  [8])&aStack_4b48;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"specularColor","");
        bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                          (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                           (string *)local_4bc8._0_8_,
                           (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                           local_4bc8._8_8_);
        if (local_4b58 != (undefined1  [8])&aStack_4b48) {
          operator_delete((void *)local_4b58,
                          CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                   aStack_4b48._M_local_buf[0]) + 1);
        }
        if (bVar9) {
          local_4bf8._M_dataplus._M_p = (pointer)&local_4bf8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4bf8,local_4bc8._0_8_,
                     (pointer)(local_4bc8._0_8_ +
                              (long)(_Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>
                                     *)local_4bc8._8_8_));
          ::std::__cxx11::string::append((char *)&local_4bf8);
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
          paVar2 = &local_4808._abs_path._prim_part.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_4808._abs_path._prim_part._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:rgb","");
          Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4ba8._M_allocated_capacity != &local_4b98) {
            operator_delete((void *)local_4ba8._M_allocated_capacity,
                            local_4b98._M_allocated_capacity + 1);
          }
          dst = local_4bd8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                            local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
            operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1
                           );
          }
          TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
          set_connection(&local_3d30.specularColor,(Path *)local_4b58);
          local_3d30.specularColor._empty = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4ab8._M_p != local_4aa8) {
            operator_delete(local_4ab8._M_p,local_4aa8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4ad8._M_p != &local_4ac8) {
            operator_delete(local_4ad8._M_p,local_4ac8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4af8._M_p != &local_4ae8) {
            operator_delete(local_4af8._M_p,local_4ae8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b18._M_p != &local_4b08) {
            operator_delete(local_4b18._M_p,local_4b08._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(uStack_4b37,bStack_4b38) != &local_4b28) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(uStack_4b37,bStack_4b38),
                            local_4b28._M_allocated_capacity + 1);
          }
          if (local_4b58 != (undefined1  [8])&aStack_4b48) {
            uVar12 = CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]) +
                     1;
            auVar19 = local_4b58;
            goto LAB_0032346f;
          }
          goto LAB_00323474;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,"ToMaterialPrim",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x3e5);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        pcVar18 = "Failed to convert \'specularColor\' texture.";
LAB_003239d2:
        lVar17 = 0x2a;
      }
      goto LAB_003239d7;
    }
    local_4b58 = *(undefined1 (*) [8])pRVar3[material_id].surfaceShader.specularColor.value._M_elems
    ;
    bStack_4b38 = false;
    uStack_4b37 = 0;
    bStack_4b30 = false;
    aStack_4b48._M_local_buf[0] = '\0';
    aStack_4b48._M_allocated_capacity._1_7_ = 0;
    aStack_4b48._M_local_buf[8] = '\0';
    aStack_4b48._9_7_ = 0;
    uVar12 = (ulong)local_4b50 >> 0x28;
    local_4b50._0_5_ =
         CONCAT14(true,*(float *)((long)&pRVar3[material_id].surfaceShader.specularColor.value + 8))
    ;
    local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(CONCAT35((int3)uVar12,(undefined5)local_4b50) & 0xffff00ffffffffff);
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::operator=
              ((optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *)
               &local_3d30.specularColor._attrib,(Animatable<tinyusdz::value::color3f> *)local_4b58)
    ;
    auVar19 = (undefined1  [8])
              CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]);
    if (auVar19 != (undefined1  [8])0x0) {
      uVar12 = CONCAT71(uStack_4b37,bStack_4b38) - (long)auVar19;
LAB_0032346f:
      operator_delete((void *)auVar19,uVar12);
    }
LAB_00323474:
    uVar12 = (ulong)pRVar3[material_id].surfaceShader.emissiveColor.texture_id;
    if ((long)uVar12 < 0) {
      local_4b58 = *(undefined1 (*) [8])
                    pRVar3[material_id].surfaceShader.emissiveColor.value._M_elems;
      bStack_4b38 = false;
      uStack_4b37 = 0;
      bStack_4b30 = false;
      aStack_4b48._M_local_buf[0] = '\0';
      aStack_4b48._M_allocated_capacity._1_7_ = 0;
      aStack_4b48._M_local_buf[8] = '\0';
      aStack_4b48._9_7_ = 0;
      uVar12 = (ulong)local_4b50 >> 0x28;
      local_4b50._0_5_ =
           CONCAT14(true,*(float *)((long)&pRVar3[material_id].surfaceShader.emissiveColor.value + 8
                                   ));
      local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(CONCAT35((int3)uVar12,(undefined5)local_4b50) & 0xffff00ffffffffff);
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::operator=
                ((optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *)
                 &local_3d30.emissiveColor._attrib,
                 (Animatable<tinyusdz::value::color3f> *)local_4b58);
      auVar19 = (undefined1  [8])
                CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]);
      if (auVar19 != (undefined1  [8])0x0) {
        uVar12 = CONCAT71(uStack_4b37,bStack_4b38) - (long)auVar19;
LAB_003238f0:
        operator_delete((void *)auVar19,uVar12);
      }
    }
    else {
      pUVar5 = (local_4bd0->textures).
               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(local_4bd0->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                 -0x7d05f417d05f417d) < uVar12) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,"ToMaterialPrim",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x3f6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        pcVar18 = "Invalid texture_id for \'emissiveColor\' texture.";
        goto LAB_00323551;
      }
      local_4bd8 = dst;
      local_4b58 = (undefined1  [8])&aStack_4b48;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"emissiveColor","");
      bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                        (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,(string *)local_4bc8._0_8_
                         ,(vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                          local_4bc8._8_8_);
      if (local_4b58 != (undefined1  [8])&aStack_4b48) {
        operator_delete((void *)local_4b58,
                        CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]
                                ) + 1);
      }
      if (!bVar9) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,"ToMaterialPrim",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x3fa);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        pcVar18 = "Failed to convert \'emissiveColor\' texture.";
        goto LAB_003239d2;
      }
      local_4bf8._M_dataplus._M_p = (pointer)&local_4bf8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4bf8,local_4bc8._0_8_,
                 (pointer)(local_4bc8._0_8_ +
                          (long)(_Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *
                                )local_4bc8._8_8_));
      ::std::__cxx11::string::append((char *)&local_4bf8);
      plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
      paVar2 = &local_4808._abs_path._prim_part.field_2;
      psVar16 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
        local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
        local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
        local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_4808._abs_path._prim_part._M_string_length = plVar11[1];
      *plVar11 = (long)psVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:rgb","");
      Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4ba8._M_allocated_capacity != &local_4b98) {
        operator_delete((void *)local_4ba8._M_allocated_capacity,
                        local_4b98._M_allocated_capacity + 1);
      }
      dst = local_4bd8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                        local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
        operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1);
      }
      TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_connection
                (&local_3d30.emissiveColor,(Path *)local_4b58);
      local_3d30.emissiveColor._empty = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4ab8._M_p != local_4aa8) {
        operator_delete(local_4ab8._M_p,local_4aa8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4ad8._M_p != &local_4ac8) {
        operator_delete(local_4ad8._M_p,local_4ac8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4af8._M_p != &local_4ae8) {
        operator_delete(local_4af8._M_p,local_4ae8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b18._M_p != &local_4b08) {
        operator_delete(local_4b18._M_p,local_4b08._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(uStack_4b37,bStack_4b38) != &local_4b28) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(uStack_4b37,bStack_4b38),local_4b28._M_allocated_capacity + 1);
      }
      if (local_4b58 != (undefined1  [8])&aStack_4b48) {
        uVar12 = CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]) + 1;
        auVar19 = local_4b58;
        goto LAB_003238f0;
      }
    }
    uVar12 = (ulong)pRVar3[material_id].surfaceShader.metallic.texture_id;
    if ((long)uVar12 < 0) {
      aStack_4b48._M_local_buf[8] = '\0';
      aStack_4b48._9_7_ = 0;
      bStack_4b38 = false;
      local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      aStack_4b48._M_local_buf[0] = '\0';
      aStack_4b48._M_allocated_capacity._1_7_ = 0;
      local_4b58._4_2_ = 1;
      local_4b58._0_4_ = pRVar3[material_id].surfaceShader.metallic.value;
      nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                ((optional<tinyusdz::Animatable<float>> *)&local_3d30.metallic._attrib,
                 (Animatable<float> *)local_4b58);
      if (local_4b50 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        uVar12 = CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) - (long)local_4b50;
        auVar19 = (undefined1  [8])local_4b50;
LAB_00323f8b:
        operator_delete((void *)auVar19,uVar12);
      }
LAB_00323f90:
      uVar12 = (ulong)pRVar3[material_id].surfaceShader.roughness.texture_id;
      if ((long)uVar12 < 0) {
        aStack_4b48._M_local_buf[8] = '\0';
        aStack_4b48._9_7_ = 0;
        bStack_4b38 = false;
        local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        aStack_4b48._M_local_buf[0] = '\0';
        aStack_4b48._M_allocated_capacity._1_7_ = 0;
        local_4b58._4_2_ = 1;
        local_4b58._0_4_ = pRVar3[material_id].surfaceShader.roughness.value;
        nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                  ((optional<tinyusdz::Animatable<float>> *)&local_3d30.roughness._attrib,
                   (Animatable<float> *)local_4b58);
        if (local_4b50 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_4b50,
                          CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) - (long)local_4b50
                         );
        }
LAB_00324328:
        uVar12 = (ulong)pRVar3[material_id].surfaceShader.clearcoat.texture_id;
        if ((long)uVar12 < 0) {
          aStack_4b48._M_local_buf[8] = '\0';
          aStack_4b48._9_7_ = 0;
          bStack_4b38 = false;
          local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          aStack_4b48._M_local_buf[0] = '\0';
          aStack_4b48._M_allocated_capacity._1_7_ = 0;
          local_4b58._4_2_ = 1;
          local_4b58._0_4_ = pRVar3[material_id].surfaceShader.clearcoat.value;
          nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                    ((optional<tinyusdz::Animatable<float>> *)&local_3d30.clearcoat._attrib,
                     (Animatable<float> *)local_4b58);
          if (local_4b50 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_4b50,
                            CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                            (long)local_4b50);
          }
        }
        else {
          pUVar5 = (local_4bd0->textures).
                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(local_4bd0->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                     -0x7d05f417d05f417d) < uVar12) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x42d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Invalid texture_id for \'clearcoat\' texture.";
            goto LAB_00324405;
          }
          local_4bd8 = dst;
          local_4b58 = (undefined1  [8])&aStack_4b48;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"clearcoat","");
          bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                            (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                             (string *)local_4bc8._0_8_,
                             (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                             local_4bc8._8_8_);
          if (local_4b58 != (undefined1  [8])&aStack_4b48) {
            operator_delete((void *)local_4b58,
                            CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                     aStack_4b48._M_local_buf[0]) + 1);
          }
          if (!bVar9) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x431);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Failed to convert \'clearcoat\' texture.";
            goto LAB_003245e2;
          }
          ::std::operator+(&local_4bf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4bc8,"/Image_Texture_");
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
          paVar2 = &local_4808._abs_path._prim_part.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_4808._abs_path._prim_part._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
          Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4ba8._M_allocated_capacity != &local_4b98) {
            operator_delete((void *)local_4ba8._M_allocated_capacity,
                            local_4b98._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                            local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
            operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1
                           );
          }
          TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                    (&local_3d30.clearcoat,(Path *)local_4b58);
          local_3d30.clearcoat._empty = true;
          Path::~Path((Path *)local_4b58);
          dst = local_4bd8;
        }
        uVar12 = (ulong)pRVar3[material_id].surfaceShader.clearcoatRoughness.texture_id;
        if ((long)uVar12 < 0) {
          aStack_4b48._M_local_buf[8] = '\0';
          aStack_4b48._9_7_ = 0;
          bStack_4b38 = false;
          local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          aStack_4b48._M_local_buf[0] = '\0';
          aStack_4b48._M_allocated_capacity._1_7_ = 0;
          local_4b58._4_2_ = 1;
          local_4b58._0_4_ = pRVar3[material_id].surfaceShader.clearcoatRoughness.value;
          nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                    ((optional<tinyusdz::Animatable<float>> *)&local_3d30.clearcoatRoughness._attrib
                     ,(Animatable<float> *)local_4b58);
          if (local_4b50 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_4b50,
                            CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                            (long)local_4b50);
          }
        }
        else {
          pUVar5 = (local_4bd0->textures).
                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(local_4bd0->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                     -0x7d05f417d05f417d) < uVar12) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x43e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Invalid texture_id for \'clearcoatRoughness\' texture.";
            lVar17 = 0x34;
            goto LAB_003239d7;
          }
          local_4bd8 = dst;
          local_4b58 = (undefined1  [8])&aStack_4b48;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4b58,"clearcoatRoughness","");
          bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                            (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                             (string *)local_4bc8._0_8_,
                             (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                             local_4bc8._8_8_);
          if (local_4b58 != (undefined1  [8])&aStack_4b48) {
            operator_delete((void *)local_4b58,
                            CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                     aStack_4b48._M_local_buf[0]) + 1);
          }
          if (!bVar9) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x442);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Failed to convert \'clearcoatRoughness\' texture.";
            goto LAB_00323551;
          }
          ::std::operator+(&local_4bf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4bc8,"/Image_Texture_");
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
          paVar2 = &local_4808._abs_path._prim_part.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_4808._abs_path._prim_part._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
          Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4ba8._M_allocated_capacity != &local_4b98) {
            operator_delete((void *)local_4ba8._M_allocated_capacity,
                            local_4b98._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                            local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
            operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1
                           );
          }
          TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                    (&local_3d30.clearcoatRoughness,(Path *)local_4b58);
          local_3d30.clearcoatRoughness._empty = true;
          Path::~Path((Path *)local_4b58);
          dst = local_4bd8;
        }
        uVar12 = (ulong)pRVar3[material_id].surfaceShader.opacity.texture_id;
        if ((long)uVar12 < 0) {
          aStack_4b48._M_local_buf[8] = '\0';
          aStack_4b48._9_7_ = 0;
          bStack_4b38 = false;
          local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          aStack_4b48._M_local_buf[0] = '\0';
          aStack_4b48._M_allocated_capacity._1_7_ = 0;
          local_4b58._4_2_ = 1;
          local_4b58._0_4_ = pRVar3[material_id].surfaceShader.opacity.value;
          nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                    ((optional<tinyusdz::Animatable<float>> *)&local_3d30.opacity._attrib,
                     (Animatable<float> *)local_4b58);
          if (local_4b50 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_4b50,
                            CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                            (long)local_4b50);
          }
        }
        else {
          pUVar5 = (local_4bd0->textures).
                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(local_4bd0->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                     -0x7d05f417d05f417d) < uVar12) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x44f);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Invalid texture_id for \'opacity\' texture.";
            goto LAB_00322e3d;
          }
          local_4bd8 = dst;
          local_4b58 = (undefined1  [8])&aStack_4b48;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"opacity","");
          bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                            (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                             (string *)local_4bc8._0_8_,
                             (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                             local_4bc8._8_8_);
          if (local_4b58 != (undefined1  [8])&aStack_4b48) {
            operator_delete((void *)local_4b58,
                            CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                     aStack_4b48._M_local_buf[0]) + 1);
          }
          if (!bVar9) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x453);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Failed to convert \'opacity\' texture.";
            lVar17 = 0x24;
            goto LAB_003239d7;
          }
          ::std::operator+(&local_4bf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4bc8,"/Image_Texture_");
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
          paVar2 = &local_4808._abs_path._prim_part.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_4808._abs_path._prim_part._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
          Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4ba8._M_allocated_capacity != &local_4b98) {
            operator_delete((void *)local_4ba8._M_allocated_capacity,
                            local_4b98._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                            local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
            operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1
                           );
          }
          TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                    (&local_3d30.opacity,(Path *)local_4b58);
          local_3d30.opacity._empty = true;
          Path::~Path((Path *)local_4b58);
          dst = local_4bd8;
        }
        uVar12 = (ulong)pRVar3[material_id].surfaceShader.opacityThreshold.texture_id;
        if ((long)uVar12 < 0) {
          aStack_4b48._M_local_buf[8] = '\0';
          aStack_4b48._9_7_ = 0;
          bStack_4b38 = false;
          local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          aStack_4b48._M_local_buf[0] = '\0';
          aStack_4b48._M_allocated_capacity._1_7_ = 0;
          local_4b58._4_2_ = 1;
          local_4b58._0_4_ = pRVar3[material_id].surfaceShader.opacityThreshold.value;
          nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                    ((optional<tinyusdz::Animatable<float>> *)&local_3d30.opacityThreshold._attrib,
                     (Animatable<float> *)local_4b58);
          if (local_4b50 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_4b50,
                            CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                            (long)local_4b50);
          }
LAB_003251a6:
          uVar12 = (ulong)pRVar3[material_id].surfaceShader.ior.texture_id;
          if ((long)uVar12 < 0) {
            aStack_4b48._M_local_buf[8] = '\0';
            aStack_4b48._9_7_ = 0;
            bStack_4b38 = false;
            local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
            aStack_4b48._M_local_buf[0] = '\0';
            aStack_4b48._M_allocated_capacity._1_7_ = 0;
            local_4b58._4_2_ = 1;
            local_4b58._0_4_ = pRVar3[material_id].surfaceShader.ior.value;
            nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                      ((optional<tinyusdz::Animatable<float>> *)&local_3d30.ior._attrib,
                       (Animatable<float> *)local_4b58);
            if (local_4b50 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_4b50,
                              CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                              (long)local_4b50);
            }
          }
          else {
            pUVar5 = (local_4bd0->textures).
                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(local_4bd0->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                       -0x7d05f417d05f417d) < uVar12) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"ToMaterialPrim",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x471);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar18 = "Invalid texture_id for \'ior\' texture.";
              goto LAB_00323de2;
            }
            local_4bd8 = dst;
            local_4b58 = (undefined1  [8])&aStack_4b48;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"ior","");
            bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                              (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                               (string *)local_4bc8._0_8_,
                               (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                               local_4bc8._8_8_);
            if (local_4b58 != (undefined1  [8])&aStack_4b48) {
              operator_delete((void *)local_4b58,
                              CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                       aStack_4b48._M_local_buf[0]) + 1);
            }
            if (!bVar9) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"ToMaterialPrim",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x475);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar18 = "Failed to convert \'ior\' texture.";
              lVar17 = 0x20;
              goto LAB_003239d7;
            }
            ::std::operator+(&local_4bf8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4bc8,"/Image_Texture_");
            plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
            paVar2 = &local_4808._abs_path._prim_part.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
              local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
              local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
              local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_4808._abs_path._prim_part._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
            Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4ba8._M_allocated_capacity != &local_4b98) {
              operator_delete((void *)local_4ba8._M_allocated_capacity,
                              local_4b98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
              operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                              local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
              operator_delete(local_4bf8._M_dataplus._M_p,
                              local_4bf8.field_2._M_allocated_capacity + 1);
            }
            TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                      (&local_3d30.ior,(Path *)local_4b58);
            local_3d30.ior._empty = true;
            Path::~Path((Path *)local_4b58);
            dst = local_4bd8;
          }
          uVar12 = (ulong)pRVar3[material_id].surfaceShader.occlusion.texture_id;
          if ((long)uVar12 < 0) {
            aStack_4b48._M_local_buf[8] = '\0';
            aStack_4b48._9_7_ = 0;
            bStack_4b38 = false;
            local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
            aStack_4b48._M_local_buf[0] = '\0';
            aStack_4b48._M_allocated_capacity._1_7_ = 0;
            local_4b58._4_2_ = 1;
            local_4b58._0_4_ = pRVar3[material_id].surfaceShader.occlusion.value;
            nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                      ((optional<tinyusdz::Animatable<float>> *)&local_3d30.occlusion._attrib,
                       (Animatable<float> *)local_4b58);
            if (local_4b50 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_4b50,
                              CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                              (long)local_4b50);
            }
          }
          else {
            pUVar5 = (local_4bd0->textures).
                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(local_4bd0->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                       -0x7d05f417d05f417d) < uVar12) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"ToMaterialPrim",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x482);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar18 = "Invalid texture_id for \'occlusion\' texture.";
              goto LAB_00324405;
            }
            local_4bd8 = dst;
            local_4b58 = (undefined1  [8])&aStack_4b48;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"occlusion","");
            bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                              (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                               (string *)local_4bc8._0_8_,
                               (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                               local_4bc8._8_8_);
            if (local_4b58 != (undefined1  [8])&aStack_4b48) {
              operator_delete((void *)local_4b58,
                              CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                       aStack_4b48._M_local_buf[0]) + 1);
            }
            if (!bVar9) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b58,"ToMaterialPrim",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x486);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar18 = "Failed to convert \'occlusion\' texture.";
              goto LAB_003245e2;
            }
            ::std::operator+(&local_4bf8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4bc8,"/Image_Texture_");
            plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
            paVar2 = &local_4808._abs_path._prim_part.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
              local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
              local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
              local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_4808._abs_path._prim_part._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
            Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4ba8._M_allocated_capacity != &local_4b98) {
              operator_delete((void *)local_4ba8._M_allocated_capacity,
                              local_4b98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
              operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                              local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
              operator_delete(local_4bf8._M_dataplus._M_p,
                              local_4bf8.field_2._M_allocated_capacity + 1);
            }
            TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                      (&local_3d30.occlusion,(Path *)local_4b58);
            local_3d30.occlusion._empty = true;
            Path::~Path((Path *)local_4b58);
            dst = local_4bd8;
          }
          uVar12 = (ulong)pRVar3[material_id].surfaceShader.normal.texture_id;
          if ((long)uVar12 < 0) {
            local_4b58 = *(undefined1 (*) [8])
                          pRVar3[material_id].surfaceShader.normal.value._M_elems;
            bStack_4b38 = false;
            uStack_4b37 = 0;
            bStack_4b30 = false;
            aStack_4b48._M_local_buf[0] = '\0';
            aStack_4b48._M_allocated_capacity._1_7_ = 0;
            aStack_4b48._M_local_buf[8] = '\0';
            aStack_4b48._9_7_ = 0;
            uVar12 = (ulong)local_4b50 >> 0x28;
            local_4b50._0_5_ =
                 CONCAT14(true,*(float *)((long)&pRVar3[material_id].surfaceShader.normal.value + 8)
                         );
            local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(CONCAT35((int3)uVar12,(undefined5)local_4b50) & 0xffff00ffffffffff);
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
            operator=((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                      &local_3d30.normal._attrib,(Animatable<tinyusdz::value::normal3f> *)local_4b58
                     );
            pvVar6 = (void *)CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                      aStack_4b48._M_local_buf[0]);
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6,CONCAT71(uStack_4b37,bStack_4b38) - (long)pvVar6);
            }
LAB_00325c8f:
            uVar12 = (ulong)pRVar3[material_id].surfaceShader.displacement.texture_id;
            if ((long)uVar12 < 0) {
              aStack_4b48._M_local_buf[8] = '\0';
              aStack_4b48._9_7_ = 0;
              bStack_4b38 = false;
              local_4b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
              aStack_4b48._M_local_buf[0] = '\0';
              aStack_4b48._M_allocated_capacity._1_7_ = 0;
              local_4b58._4_2_ = 1;
              local_4b58._0_4_ = pRVar3[material_id].surfaceShader.displacement.value;
              nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                        ((optional<tinyusdz::Animatable<float>> *)&local_3d30.displacement._attrib,
                         (Animatable<float> *)local_4b58);
              pPVar8 = dst;
              if (local_4b50 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_4b50,
                                CONCAT71(aStack_4b48._9_7_,aStack_4b48._M_local_buf[8]) -
                                (long)local_4b50);
                pPVar8 = dst;
              }
            }
            else {
              pUVar5 = (local_4bd0->textures).
                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(local_4bd0->textures).
                                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                         -0x7d05f417d05f417d) < uVar12) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4b58,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4b58,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4b58,"ToMaterialPrim",0xe);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x4a8);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                pcVar18 = "Invalid texture_id for \'displacement\' texture.";
                lVar17 = 0x2e;
                goto LAB_003239d7;
              }
              local_4bd8 = dst;
              local_4b58 = (undefined1  [8])&aStack_4b48;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4b58,"displacement","");
              bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                                 (string *)local_4bc8._0_8_,
                                 (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                                 local_4bc8._8_8_);
              if (local_4b58 != (undefined1  [8])&aStack_4b48) {
                operator_delete((void *)local_4b58,
                                CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                         aStack_4b48._M_local_buf[0]) + 1);
              }
              if (!bVar9) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4b58,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4b58,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4b58,"ToMaterialPrim",0xe);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x4ac);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                pcVar18 = "Failed to convert \'displacement\' texture.";
                goto LAB_00322e3d;
              }
              ::std::operator+(&local_4bf8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4bc8,"/Image_Texture_");
              plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
              paVar2 = &local_4808._abs_path._prim_part.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
                local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
                local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
                local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_4808._abs_path._prim_part._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4ba8,"outputs:rgb","");
              Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4ba8._M_allocated_capacity != &local_4b98) {
                operator_delete((void *)local_4ba8._M_allocated_capacity,
                                local_4b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
                operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                                local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
                operator_delete(local_4bf8._M_dataplus._M_p,
                                local_4bf8.field_2._M_allocated_capacity + 1);
              }
              TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                        (&local_3d30.displacement,(Path *)local_4b58);
              local_3d30.displacement._empty = true;
              Path::~Path((Path *)local_4b58);
              pPVar8 = local_4bd8;
            }
            local_4bd8 = pPVar8;
            paVar2 = &local_4808._abs_path._prim_part.field_2;
            local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4808,"outputs:surface","");
            Path::Path((Path *)local_4b58,&local_44b8,(string *)&local_4808);
            TypedConnection<tinyusdz::Token>::set(&local_df0.surface,(Path *)local_4b58);
            Path::~Path((Path *)local_4b58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
              operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                              local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
            }
            linb::any::operator=(&local_4498.value.v_,&local_3d30);
            UsdPreviewSurface::~UsdPreviewSurface(&local_3d30);
            Prim::Prim<tinyusdz::Shader>((Prim *)&local_3d30,&local_4498);
            Prim::Prim<tinyusdz::Material>((Prim *)local_4b58,&local_df0);
            Prim::add_child((Prim *)local_4b58,(Prim *)&local_3d30,true,(string *)0x0);
            pSVar7 = local_4b78.
                     super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl
                     .super__Vector_impl_data._M_finish;
            if (local_4b78.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_4b78.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              bVar9 = false;
              prim = local_4b78.
                     super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl
                     .super__Vector_impl_data._M_start;
              do {
                Prim::Prim<tinyusdz::Shader>(&local_4808,prim);
                bVar10 = Prim::add_child((Prim *)local_4b58,&local_4808,false,local_4c00);
                Prim::~Prim(&local_4808);
                if (!bVar10) goto LAB_0032616e;
                prim = prim + 1;
              } while (prim != pSVar7);
            }
            Prim::operator=(local_4bd8,(Prim *)local_4b58);
            bVar9 = true;
LAB_0032616e:
            Prim::~Prim((Prim *)local_4b58);
            Prim::~Prim((Prim *)&local_3d30);
            goto LAB_00323ae9;
          }
          pUVar5 = (local_4bd0->textures).
                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(local_4bd0->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                     -0x7d05f417d05f417d) < uVar12) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x493);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Invalid texture_id for \'normal\' texture.";
            lVar17 = 0x28;
          }
          else {
            local_4bd8 = dst;
            local_4b58 = (undefined1  [8])&aStack_4b48;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"normal","");
            bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                              (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                               (string *)local_4bc8._0_8_,
                               (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                               local_4bc8._8_8_);
            if (local_4b58 != (undefined1  [8])&aStack_4b48) {
              operator_delete((void *)local_4b58,
                              CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                       aStack_4b48._M_local_buf[0]) + 1);
            }
            if (bVar9) {
              ::std::operator+(&local_4bf8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4bc8,"/Image_Texture_");
              plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
              paVar2 = &local_4808._abs_path._prim_part.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
                local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
                local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
                local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_4808._abs_path._prim_part._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4ba8,"outputs:rgb","");
              Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4ba8._M_allocated_capacity != &local_4b98) {
                operator_delete((void *)local_4ba8._M_allocated_capacity,
                                local_4b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
                operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                                local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
                operator_delete(local_4bf8._M_dataplus._M_p,
                                local_4bf8.field_2._M_allocated_capacity + 1);
              }
              TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
              set_connection(&local_3d30.normal,(Path *)local_4b58);
              local_3d30.normal._empty = true;
              Path::~Path((Path *)local_4b58);
              dst = local_4bd8;
              goto LAB_00325c8f;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x497);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Failed to convert \'normal\' texture.";
            lVar17 = 0x23;
          }
        }
        else {
          pUVar5 = (local_4bd0->textures).
                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(local_4bd0->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                     -0x7d05f417d05f417d) < uVar12) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x460);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Invalid texture_id for \'opacityThreshold\' texture.";
            lVar17 = 0x32;
          }
          else {
            local_4bd8 = dst;
            local_4b58 = (undefined1  [8])&aStack_4b48;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4b58,"opacityThreshold","");
            bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                              (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                               (string *)local_4bc8._0_8_,
                               (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                               local_4bc8._8_8_);
            if (local_4b58 != (undefined1  [8])&aStack_4b48) {
              operator_delete((void *)local_4b58,
                              CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                       aStack_4b48._M_local_buf[0]) + 1);
            }
            if (bVar9) {
              ::std::operator+(&local_4bf8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4bc8,"/Image_Texture_");
              plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
              paVar2 = &local_4808._abs_path._prim_part.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
                local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
                local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
                local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_4808._abs_path._prim_part._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4ba8,"outputs:r","");
              Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4ba8._M_allocated_capacity != &local_4b98) {
                operator_delete((void *)local_4ba8._M_allocated_capacity,
                                local_4b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
                operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                                local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
                operator_delete(local_4bf8._M_dataplus._M_p,
                                local_4bf8.field_2._M_allocated_capacity + 1);
              }
              TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                        (&local_3d30.opacityThreshold,(Path *)local_4b58);
              local_3d30.opacityThreshold._empty = true;
              Path::~Path((Path *)local_4b58);
              dst = local_4bd8;
              goto LAB_003251a6;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b58,"ToMaterialPrim",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x464);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar18 = "Failed to convert \'opacityThreshold\' texture.";
            lVar17 = 0x2d;
          }
        }
      }
      else {
        pUVar5 = (local_4bd0->textures).
                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(local_4bd0->textures).
                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                   -0x7d05f417d05f417d) < uVar12) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4b58,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4b58,"ToMaterialPrim",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
          poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x41c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          pcVar18 = "Invalid texture_id for \'roughness\' texture.";
LAB_00324405:
          lVar17 = 0x2b;
        }
        else {
          local_4bd8 = dst;
          local_4b58 = (undefined1  [8])&aStack_4b48;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"roughness","");
          bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                            (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,
                             (string *)local_4bc8._0_8_,
                             (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                             local_4bc8._8_8_);
          if (local_4b58 != (undefined1  [8])&aStack_4b48) {
            operator_delete((void *)local_4b58,
                            CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,
                                     aStack_4b48._M_local_buf[0]) + 1);
          }
          if (bVar9) {
            ::std::operator+(&local_4bf8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4bc8,"/Image_Texture_");
            plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
            paVar2 = &local_4808._abs_path._prim_part.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
              local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
              local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
              local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_4808._abs_path._prim_part._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
            Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4ba8._M_allocated_capacity != &local_4b98) {
              operator_delete((void *)local_4ba8._M_allocated_capacity,
                              local_4b98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
              operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                              local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
              operator_delete(local_4bf8._M_dataplus._M_p,
                              local_4bf8.field_2._M_allocated_capacity + 1);
            }
            TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                      (&local_3d30.roughness,(Path *)local_4b58);
            local_3d30.roughness._empty = true;
            Path::~Path((Path *)local_4b58);
            dst = local_4bd8;
            goto LAB_00324328;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4b58,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4b58,"ToMaterialPrim",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
          poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x420);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          pcVar18 = "Failed to convert \'roughness\' texture.";
LAB_003245e2:
          lVar17 = 0x26;
        }
      }
    }
    else {
      pUVar5 = (local_4bd0->textures).
               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(local_4bd0->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                 -0x7d05f417d05f417d) < uVar12) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b58,"ToMaterialPrim",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x40b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        pcVar18 = "Invalid texture_id for \'metallic\' texture.";
        goto LAB_003239d2;
      }
      local_4bd8 = dst;
      local_4b58 = (undefined1  [8])&aStack_4b48;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"metallic","");
      bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                        (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,(string *)local_4bc8._0_8_
                         ,(vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                          local_4bc8._8_8_);
      if (local_4b58 != (undefined1  [8])&aStack_4b48) {
        operator_delete((void *)local_4b58,
                        CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]
                                ) + 1);
      }
      if (bVar9) {
        local_4bf8._M_dataplus._M_p = (pointer)&local_4bf8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4bf8,local_4bc8._0_8_,
                   (pointer)(local_4bc8._0_8_ +
                            (long)(_Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>
                                   *)local_4bc8._8_8_));
        ::std::__cxx11::string::append((char *)&local_4bf8);
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
        paVar2 = &local_4808._abs_path._prim_part.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
          local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
          local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
          local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_4808._abs_path._prim_part._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:r","");
        Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4ba8._M_allocated_capacity != &local_4b98) {
          operator_delete((void *)local_4ba8._M_allocated_capacity,
                          local_4b98._M_allocated_capacity + 1);
        }
        dst = local_4bd8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                          local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
          operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1);
        }
        TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                  (&local_3d30.metallic,(Path *)local_4b58);
        local_3d30.metallic._empty = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4ab8._M_p != local_4aa8) {
          operator_delete(local_4ab8._M_p,local_4aa8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4ad8._M_p != &local_4ac8) {
          operator_delete(local_4ad8._M_p,local_4ac8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4af8._M_p != &local_4ae8) {
          operator_delete(local_4af8._M_p,local_4ae8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b18._M_p != &local_4b08) {
          operator_delete(local_4b18._M_p,local_4b08._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_4b37,bStack_4b38) != &local_4b28) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_4b37,bStack_4b38),local_4b28._M_allocated_capacity + 1)
          ;
        }
        if (local_4b58 != (undefined1  [8])&aStack_4b48) {
          uVar12 = CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]) + 1
          ;
          auVar19 = local_4b58;
          goto LAB_00323f8b;
        }
        goto LAB_00323f90;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b58,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b58,"ToMaterialPrim",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
      poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x40f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      pcVar18 = "Failed to convert \'metallic\' texture.";
LAB_00323de2:
      lVar17 = 0x25;
    }
LAB_003239d7:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,pcVar18,lVar17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"\n",1);
    if (local_4c00 != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
LAB_00323a1e:
      plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
      paVar2 = &local_4808._abs_path._prim_part.field_2;
      psVar16 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
        local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
        local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
        local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_4808._abs_path._prim_part._M_string_length = plVar11[1];
      *plVar11 = (long)psVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)local_4c00,(ulong)local_4808._abs_path._prim_part._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                        local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
        operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pUVar5 = (local_4bd0->textures).
             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar12 <= (ulong)(((long)(local_4bd0->textures).
                                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
                         -0x7d05f417d05f417d)) {
      local_4bd8 = dst;
      local_4b58 = (undefined1  [8])&aStack_4b48;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b58,"diffuseColor","");
      bVar9 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                        (&local_4b88,pUVar5 + uVar12,(string *)local_4b58,(string *)local_4bc8._0_8_
                         ,(vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                          local_4bc8._8_8_);
      if (local_4b58 != (undefined1  [8])&aStack_4b48) {
        operator_delete((void *)local_4b58,
                        CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]
                                ) + 1);
      }
      if (bVar9) {
        local_4bf8._M_dataplus._M_p = (pointer)&local_4bf8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4bf8,local_4bc8._0_8_,
                   (pointer)(local_4bc8._0_8_ +
                            (long)(_Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>
                                   *)local_4bc8._8_8_));
        ::std::__cxx11::string::append((char *)&local_4bf8);
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_4bf8);
        paVar2 = &local_4808._abs_path._prim_part.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
          local_4808._abs_path._prim_part.field_2._8_8_ = plVar11[3];
          local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_4808._abs_path._prim_part.field_2._M_allocated_capacity = *psVar16;
          local_4808._abs_path._prim_part._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_4808._abs_path._prim_part._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        local_4ba8._M_allocated_capacity = (size_type)&local_4b98;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ba8,"outputs:rgb","");
        Path::Path((Path *)local_4b58,(string *)&local_4808,(string *)&local_4ba8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4ba8._M_allocated_capacity != &local_4b98) {
          operator_delete((void *)local_4ba8._M_allocated_capacity,
                          local_4b98._M_allocated_capacity + 1);
        }
        dst = local_4bd8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4808._abs_path._prim_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_4808._abs_path._prim_part._M_dataplus._M_p,
                          local_4808._abs_path._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4bf8._M_dataplus._M_p != &local_4bf8.field_2) {
          operator_delete(local_4bf8._M_dataplus._M_p,local_4bf8.field_2._M_allocated_capacity + 1);
        }
        TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_connection
                  (&local_3d30.diffuseColor,(Path *)local_4b58);
        local_3d30.diffuseColor._empty = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4ab8._M_p != local_4aa8) {
          operator_delete(local_4ab8._M_p,local_4aa8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4ad8._M_p != &local_4ac8) {
          operator_delete(local_4ad8._M_p,local_4ac8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4af8._M_p != &local_4ae8) {
          operator_delete(local_4af8._M_p,local_4ae8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b18._M_p != &local_4b08) {
          operator_delete(local_4b18._M_p,local_4b08._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_4b37,bStack_4b38) != &local_4b28) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_4b37,bStack_4b38),local_4b28._M_allocated_capacity + 1)
          ;
        }
        if (local_4b58 != (undefined1  [8])&aStack_4b48) {
          uVar12 = CONCAT71(aStack_4b48._M_allocated_capacity._1_7_,aStack_4b48._M_local_buf[0]) + 1
          ;
          auVar19 = local_4b58;
          goto LAB_00322fe6;
        }
        goto LAB_00322feb;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b58,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b58,"ToMaterialPrim",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
      poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x3cf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      pcVar18 = "Failed to convert \'diffuseColor\' texture.";
LAB_00322e3d:
      lVar17 = 0x29;
      goto LAB_003239d7;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b58);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b58,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"ToMaterialPrim",0xe)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"():",3);
    poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4b58,0x3cb);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b58,"Invalid texture_id for \'diffuseColor\' texture.",0x2e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b58,"\n",1);
    if (local_4c00 != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      goto LAB_00323a1e;
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b58);
  ::std::ios_base::~ios_base((ios_base *)local_4ae8._M_local_buf);
  UsdPreviewSurface::~UsdPreviewSurface(&local_3d30);
  bVar9 = false;
LAB_00323ae9:
  ::std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>::~vector(&local_4b78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_44b8._M_dataplus._M_p != &local_44b8.field_2) {
    operator_delete(local_44b8._M_dataplus._M_p,local_44b8.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_4bc8._0_8_ != (string *)(local_4bc8 + 0x10)) {
    operator_delete((void *)local_4bc8._0_8_,(ulong)(local_4bc8._16_8_ + 1));
  }
  if (local_4498.value.v_.vtable != (vtable_type *)0x0) {
    (*(local_4498.value.v_.vtable)->destroy)((storage_union *)&local_4498.value);
    local_4498.value.v_.vtable = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4498.info_id._M_dataplus._M_p != &local_4498.info_id.field_2) {
    operator_delete(local_4498.info_id._M_dataplus._M_p,
                    CONCAT71(local_4498.info_id.field_2._M_allocated_capacity._1_7_,
                             local_4498.info_id.field_2._M_local_buf[0]) + 1);
  }
  UsdShadePrim::~UsdShadePrim(&local_4498.super_UsdShadePrim);
  AttrMetas::~AttrMetas(&local_df0.volume._metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            (&local_df0.volume._targetPaths);
  AttrMetas::~AttrMetas(&local_df0.displacement._metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            (&local_df0.displacement._targetPaths);
  AttrMetas::~AttrMetas(&local_df0.surface._metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            (&local_df0.surface._targetPaths);
  UsdShadePrim::~UsdShadePrim(&local_df0.super_UsdShadePrim);
  return bVar9;
}

Assistant:

static bool ToMaterialPrim(const RenderScene &scene, const std::string &abs_path, size_t material_id, Prim *dst, std::string *err) {

  const RenderMaterial &rmat = scene.materials[material_id];

  // TODO: create two UsdUVTextures for RGBA imagge(rgb and alpha)
  auto ConstructUVTexture = [&](const UVTexture &tex, const std::string &param_name, const std::string &abs_mat_path, /* inout */std::vector<Shader> &shader_nodes) -> bool {


    std::string preaderPrimPath = abs_mat_path + "/uvmap_" + param_name + ".outputs:result";
    Path preaderPath(preaderPrimPath, "");

    if ((tex.texture_image_id < 0) || (size_t(tex.texture_image_id) >= scene.images.size())) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture_image_id for `{}`", param_name));
    }

    const TextureImage &src_teximg = scene.images[size_t(tex.texture_image_id)];

    UsdUVTexture image_tex;
    image_tex.name = "Image_Texture_" + param_name;

    DCOUT("asset_identifier: " << src_teximg.asset_identifier);
    if (src_teximg.asset_identifier.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format("file asset name is empty for texture image `{}`", param_name));
    }
    value::AssetPath fileAssetPath(src_teximg.asset_identifier);
    image_tex.file = fileAssetPath;

    // TODO: Set colorSpace in attribute meta.
    Animatable<UsdUVTexture::SourceColorSpace> sourceColorSpace;
    if (src_teximg.colorSpace == ColorSpace::sRGB) {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::SRGB);
    } else if (src_teximg.colorSpace == ColorSpace::Raw) {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::Raw);
    } else {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::Auto);
    }
    image_tex.sourceColorSpace.set_value(sourceColorSpace);
    
    image_tex.st.set_connection(preaderPath);
    image_tex.st.set_value_empty(); // connection only

    Animatable<UsdUVTexture::Wrap> wrapS;
    if (tex.wrapS == UVTexture::WrapMode::CLAMP_TO_EDGE) {
      wrapS.set_default(UsdUVTexture::Wrap::Clamp);
    } else if (tex.wrapS == UVTexture::WrapMode::REPEAT) {
      wrapS.set_default(UsdUVTexture::Wrap::Repeat);
    } else if (tex.wrapS == UVTexture::WrapMode::MIRROR) {
      wrapS.set_default(UsdUVTexture::Wrap::Mirror);
    } else if (tex.wrapS == UVTexture::WrapMode::CLAMP_TO_BORDER) {
      wrapS.set_default(UsdUVTexture::Wrap::Black);
    } else {
      wrapS.set_default(UsdUVTexture::Wrap::Repeat);
    }
    image_tex.wrapS.set_value(wrapS);

    Animatable<UsdUVTexture::Wrap> wrapT;
    if (tex.wrapT == UVTexture::WrapMode::CLAMP_TO_EDGE) {
      wrapT.set_default(UsdUVTexture::Wrap::Clamp);
    } else if (tex.wrapT == UVTexture::WrapMode::REPEAT) {
      wrapT.set_default(UsdUVTexture::Wrap::Repeat);
    } else if (tex.wrapT == UVTexture::WrapMode::MIRROR) {
      wrapT.set_default(UsdUVTexture::Wrap::Mirror);
    } else if (tex.wrapT == UVTexture::WrapMode::CLAMP_TO_BORDER) {
      wrapT.set_default(UsdUVTexture::Wrap::Black);
    } else {
      wrapT.set_default(UsdUVTexture::Wrap::Repeat);
    }
    image_tex.wrapT.set_value(wrapS);

    for (const auto &c : tex.authoredOutputChannels) {
      if (c == UVTexture::Channel::R) {
        image_tex.outputsR.set_authored(true);
      } else if (c == UVTexture::Channel::G) {
        image_tex.outputsG.set_authored(true);
      } else if (c == UVTexture::Channel::B) {
        image_tex.outputsB.set_authored(true);
      } else if (c == UVTexture::Channel::RGB) {
        image_tex.outputsRGB.set_authored(true);
      } else if (c == UVTexture::Channel::RGBA) {
        PUSH_ERROR_AND_RETURN("rgba texture is not supported yet.");
      } 
    }

    UsdTransform2d uv_xform;
    uv_xform.name = "place2d_" + param_name;
    if (tex.has_transform2d) {
      // TODO: Deompose tex.transform and use it?
      uv_xform.translation = tex.tx_translation;
      uv_xform.rotation = tex.tx_rotation;
      uv_xform.scale = tex.tx_scale;

      Shader uv_xformShader;
      uv_xformShader.name = "place2d_" + param_name;
      uv_xformShader.info_id = tinyusdz::kUsdTransform2d;
      uv_xformShader.value = uv_xform;
      shader_nodes.emplace_back(std::move(uv_xformShader));
    }

    UsdPrimvarReader_float2 preader;
    preader.name = "primvar_reader_" + param_name;

    value::float2 fallback_value;
    fallback_value[0] = tex.fallback_uv[0];
    fallback_value[1] = tex.fallback_uv[1];
    if (!math::is_close(fallback_value, {0.0f, 0.0f})) {
      preader.fallback = fallback_value;
    }

    Animatable<std::string> varname;
    // TODO: Ensure primvar with 'varname_uv' exists in bound RenderMesh.
    DCOUT("varname = " << tex.varname_uv);
    varname.set_default(tex.varname_uv);
    preader.varname.set_value(varname);
    preader.result.set_authored(true);


    Shader preaderShader;
    preaderShader.name = "uvmap_" + param_name;
    preaderShader.info_id = tinyusdz::kUsdPrimvarReader_float2;
    preaderShader.value = preader;

    shader_nodes.emplace_back(std::move(preaderShader));

    Shader imageTexShader;
    imageTexShader.name = "Image_Texture_" + param_name;
    imageTexShader.info_id = tinyusdz::kUsdUVTexture;
    imageTexShader.value = image_tex;

    shader_nodes.emplace_back(std::move(imageTexShader));
    
    return true;
  };


  // Layout
  //
  // - Material
  //   - Shader(UsdPreviewSurface)
  //     - UsdUVTexture(Shader)
  //     - TexTransform2d(Shader)
  //     - PrimvarReader
  //

  Material mat;

  mat.name = rmat.name;

  Shader shader;  // root Shader 
  shader.name = "defaultPBR";

  std::string abs_mat_path = abs_path + "/" + mat.name;
  std::string abs_shader_path = abs_mat_path + "/" + shader.name;

  std::vector<Shader> shader_nodes;
  
  {
    UsdPreviewSurface surfaceShader;  // Concrete Shader node object

    //
    // Asssign actual shader object to Shader::value.
    // Also do not forget set its shader node type name through Shader::info_id
    //
    shader.info_id = tinyusdz::kUsdPreviewSurface;  // "UsdPreviewSurface" token

    //
    // Currently no shader network/connection API.
    // Manually construct it.
    //
    surfaceShader.outputsSurface.set_authored(
        true);  // Author `token outputs:surface`

    surfaceShader.useSpecularWorkflow = rmat.surfaceShader.useSpecularWorkflow ? 1 : 0;

    if (rmat.surfaceShader.diffuseColor.is_texture()) {

      if (size_t(rmat.surfaceShader.diffuseColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'diffuseColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.diffuseColor.texture_id)], "diffuseColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'diffuseColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "diffuseColor", "outputs:rgb");
      surfaceShader.diffuseColor.set_connection(connPath);
      surfaceShader.diffuseColor.set_value_empty();
    } else {
      value::color3f diffuseCol;
      diffuseCol.r = rmat.surfaceShader.diffuseColor.value[0];
      diffuseCol.g = rmat.surfaceShader.diffuseColor.value[1];
      diffuseCol.b = rmat.surfaceShader.diffuseColor.value[2];

      surfaceShader.diffuseColor.set_value(diffuseCol);
    }

    if (rmat.surfaceShader.specularColor.is_texture()) {

      if (size_t(rmat.surfaceShader.specularColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'specularColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.specularColor.texture_id)], "specularColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'specularColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "specularColor", "outputs:rgb");
      surfaceShader.specularColor.set_connection(connPath);
      surfaceShader.specularColor.set_value_empty();
    } else {
      value::color3f col;
      col.r = rmat.surfaceShader.specularColor.value[0];
      col.g = rmat.surfaceShader.specularColor.value[1];
      col.b = rmat.surfaceShader.specularColor.value[2];
      surfaceShader.specularColor = col;
    }

    if (rmat.surfaceShader.emissiveColor.is_texture()) {

      if (size_t(rmat.surfaceShader.emissiveColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'emissiveColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.emissiveColor.texture_id)], "emissiveColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'emissiveColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "emissiveColor", "outputs:rgb");
      surfaceShader.emissiveColor.set_connection(connPath);
      surfaceShader.emissiveColor.set_value_empty();
    } else {
      value::color3f col;
      col.r = rmat.surfaceShader.emissiveColor.value[0];
      col.g = rmat.surfaceShader.emissiveColor.value[1];
      col.b = rmat.surfaceShader.emissiveColor.value[2];
      surfaceShader.emissiveColor = col;
    }

    if (rmat.surfaceShader.metallic.is_texture()) {

      if (size_t(rmat.surfaceShader.metallic.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'metallic' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.metallic.texture_id)], "metallic", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'metallic' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "metallic", "outputs:r");
      surfaceShader.metallic.set_connection(connPath);
      surfaceShader.metallic.set_value_empty();
    } else {
      surfaceShader.metallic = rmat.surfaceShader.metallic.value;
    }

    if (rmat.surfaceShader.roughness.is_texture()) {

      if (size_t(rmat.surfaceShader.roughness.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'roughness' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.roughness.texture_id)], "roughness", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'roughness' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "roughness", "outputs:r");
      surfaceShader.roughness.set_connection(connPath);
      surfaceShader.roughness.set_value_empty();
    } else {
      surfaceShader.roughness = rmat.surfaceShader.roughness.value;
    }

    if (rmat.surfaceShader.clearcoat.is_texture()) {

      if (size_t(rmat.surfaceShader.clearcoat.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'clearcoat' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.clearcoat.texture_id)], "clearcoat", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'clearcoat' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "clearcoat", "outputs:r");
      surfaceShader.clearcoat.set_connection(connPath);
      surfaceShader.clearcoat.set_value_empty();
    } else {
      surfaceShader.clearcoat = rmat.surfaceShader.clearcoat.value;
    }

    if (rmat.surfaceShader.clearcoatRoughness.is_texture()) {

      if (size_t(rmat.surfaceShader.clearcoatRoughness.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'clearcoatRoughness' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.clearcoatRoughness.texture_id)], "clearcoatRoughness", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'clearcoatRoughness' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "clearcoatRoughness", "outputs:r");
      surfaceShader.clearcoatRoughness.set_connection(connPath);
      surfaceShader.clearcoatRoughness.set_value_empty();
    } else {
      surfaceShader.clearcoatRoughness = rmat.surfaceShader.clearcoatRoughness.value;
    }

    if (rmat.surfaceShader.opacity.is_texture()) {

      if (size_t(rmat.surfaceShader.opacity.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'opacity' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.opacity.texture_id)], "opacity", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'opacity' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "opacity", "outputs:r");
      surfaceShader.opacity.set_connection(connPath);
      surfaceShader.opacity.set_value_empty();
    } else {
      surfaceShader.opacity = rmat.surfaceShader.opacity.value;
    }

    if (rmat.surfaceShader.opacityThreshold.is_texture()) {

      if (size_t(rmat.surfaceShader.opacityThreshold.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'opacityThreshold' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.opacityThreshold.texture_id)], "opacityThreshold", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'opacityThreshold' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "opacityThreshold", "outputs:r");
      surfaceShader.opacityThreshold.set_connection(connPath);
      surfaceShader.opacityThreshold.set_value_empty();
    } else {
      surfaceShader.opacityThreshold = rmat.surfaceShader.opacityThreshold.value;
    }

    if (rmat.surfaceShader.ior.is_texture()) {

      if (size_t(rmat.surfaceShader.ior.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'ior' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.ior.texture_id)], "ior", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'ior' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "ior", "outputs:r");
      surfaceShader.ior.set_connection(connPath);
      surfaceShader.ior.set_value_empty();
    } else {
      surfaceShader.ior = rmat.surfaceShader.ior.value;
    }

    if (rmat.surfaceShader.occlusion.is_texture()) {

      if (size_t(rmat.surfaceShader.occlusion.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'occlusion' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.occlusion.texture_id)], "occlusion", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'occlusion' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "occlusion", "outputs:r");
      surfaceShader.occlusion.set_connection(connPath);
      surfaceShader.occlusion.set_value_empty();
    } else {
      surfaceShader.occlusion = rmat.surfaceShader.occlusion.value;
    }

    if (rmat.surfaceShader.normal.is_texture()) {

      if (size_t(rmat.surfaceShader.normal.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'normal' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.normal.texture_id)], "normal", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'normal' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "normal", "outputs:rgb");
      surfaceShader.normal.set_connection(connPath);
      surfaceShader.normal.set_value_empty();
    } else {
      value::normal3f n;
      n[0] = rmat.surfaceShader.normal.value[0];
      n[1] = rmat.surfaceShader.normal.value[1];
      n[2] = rmat.surfaceShader.normal.value[2];
      surfaceShader.normal = n;
    }

    if (rmat.surfaceShader.displacement.is_texture()) {

      if (size_t(rmat.surfaceShader.displacement.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'displacement' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.displacement.texture_id)], "displacement", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'displacement' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "displacement", "outputs:rgb");
      surfaceShader.displacement.set_connection(connPath);
      surfaceShader.displacement.set_value_empty();
    
    } else {
      surfaceShader.displacement = rmat.surfaceShader.displacement.value;
    }

    // Connect to UsdPreviewSurface's outputs:surface by setting targetPath.
    //
    // token outputs:surface = </path/to/mat/defaultPBR.outputs:surface>
    mat.surface.set(tinyusdz::Path(/* prim path */ abs_shader_path,
                                   /* prop path */ "outputs:surface"));

    //
    // Shaer::value is `value::Value` type, so can use '=' to assign Shader
    // object.
    //
    shader.value = std::move(surfaceShader);
  }

  Prim shaderPrim(shader);

  Prim matPrim(mat);

  matPrim.add_child(std::move(shaderPrim));

  for (const auto &node : shader_nodes) {
    Prim shaderNodePrim(node);
    
    if (!matPrim.add_child(std::move(shaderNodePrim), /* rename_primname */false, err)) {
      return false;
    } 
  }
  
  (*dst) = std::move(matPrim);
  return true;
}